

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveInstantiation.cpp
# Opt level: O3

bool __thiscall
Inferences::PrimitiveInstantiation::IsInstantiable::operator()(IsInstantiable *this,Literal *l)

{
  TermList TVar1;
  TermList TVar2;
  ulong uVar3;
  bool bVar4;
  TermList head;
  TermList local_40;
  TermStack local_38;
  
  TVar1 = Kernel::SortHelper::getEqualityArgumentSort(l);
  TVar2 = Kernel::AtomicSort::boolSort();
  if (TVar1._content == TVar2._content) {
    uVar3 = (ulong)(*(uint *)&(l->super_Term).field_0xc & 0xfffffff);
    TVar1._content = (l->super_Term)._args[uVar3 - 1]._content;
    local_40._content = 2;
    local_38._cursor = (TermList *)0x0;
    local_38._end = (TermList *)0x0;
    local_38._capacity = 0;
    local_38._stack = (TermList *)0x0;
    ApplicativeHelper::getHeadAndArgs
              ((TermList)(l->super_Term)._args[uVar3]._content,&local_40,&local_38);
    bVar4 = true;
    if ((local_40._content & 1) == 0) {
      ApplicativeHelper::getHeadAndArgs(TVar1,&local_40,&local_38);
      bVar4 = (bool)((byte)local_40._content & 1);
    }
    if (local_38._stack != (TermList *)0x0) {
      uVar3 = local_38._capacity * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar3 == 0) {
        (local_38._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_38._stack;
      }
      else if (uVar3 < 0x11) {
        (local_38._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_38._stack;
      }
      else if (uVar3 < 0x19) {
        (local_38._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_38._stack;
      }
      else if (uVar3 < 0x21) {
        (local_38._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_38._stack;
      }
      else if (uVar3 < 0x31) {
        (local_38._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_38._stack;
      }
      else if (uVar3 < 0x41) {
        (local_38._stack)->_content = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_38._stack;
      }
      else {
        operator_delete(local_38._stack,0x10);
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool operator()(Literal* l)
  { 
    if(SortHelper::getEqualityArgumentSort(l) != AtomicSort::boolSort()){
      return false;
    }
    
    TermList lhs = *(l->nthArgument(0));
    TermList rhs = *(l->nthArgument(1));
    
    TermList head;
    TermStack args;
    ApplicativeHelper::getHeadAndArgs(lhs, head, args);
    if(head.isVar()){ return true; }
    ApplicativeHelper::getHeadAndArgs(rhs, head, args);
    if(head.isVar()){ return true; }

    return false; 
  }